

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::MultiThreadedStrategy::HasAvailableCapacity::test_method
          (HasAvailableCapacity *this)

{
  undefined8 uVar1;
  bool bVar2;
  MultiThreadedStrategy *this_00;
  long in_RDI;
  int64_t return_value;
  Sequence cursor;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> one_dependents;
  int64_t in_stack_fffffffffffffc68;
  Sequence *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_fffffffffffffc90;
  MultiThreadedStrategy *in_stack_fffffffffffffc98;
  MultiThreadedStrategy *in_stack_fffffffffffffca0;
  ClaimStrategyFixture<disruptor::MultiThreadedStrategy> *in_stack_fffffffffffffcb8;
  int64_t local_2b8;
  undefined1 local_2b0 [32];
  undefined1 local_290 [40];
  undefined1 local_268 [16];
  basic_cstring<const_char> local_258;
  int64_t local_248;
  undefined1 local_240 [32];
  undefined1 local_220 [40];
  undefined1 local_1f8 [16];
  basic_cstring<const_char> local_1e8;
  undefined1 local_1d2 [18];
  undefined1 local_1c0 [40];
  undefined1 local_198 [16];
  basic_cstring<const_char> local_188;
  int64_t local_178;
  undefined1 local_16a [18];
  undefined1 local_158 [40];
  undefined1 local_130 [16];
  basic_cstring<const_char> local_120;
  undefined1 local_110 [24];
  undefined1 local_f8 [40];
  undefined1 local_d0 [16];
  basic_cstring<const_char> local_c0;
  int64_t local_b0 [22];
  
  ClaimStrategyFixture<disruptor::MultiThreadedStrategy>::oneDependents(in_stack_fffffffffffffcb8);
  Sequence::Sequence(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  local_b0[0] = disruptor::MultiThreadedStrategy::IncrementAndGet
                          (in_stack_fffffffffffffca0,(Sequence *)in_stack_fffffffffffffc98,
                           in_stack_fffffffffffffc90,
                           CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x91,local_d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc78,(char (*) [1])in_stack_fffffffffffffc70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_110 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    local_110._0_8_ = 7;
    in_stack_fffffffffffffc78 = "kInitialCursorValue + 8";
    in_stack_fffffffffffffc70 = (Sequence *)local_110;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_f8,local_110 + 8,0x91,1,2,local_b0,"return_value");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x110166);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x93,local_130);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc78,(char (*) [1])in_stack_fffffffffffffc70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_16a + 2),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    Sequence::sequence((Sequence *)in_stack_fffffffffffffc78);
    local_16a[1] = disruptor::MultiThreadedStrategy::HasAvailableCapacity
                             (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                              CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                              in_stack_fffffffffffffc84);
    local_16a[0] = 0;
    in_stack_fffffffffffffc78 = "false";
    in_stack_fffffffffffffc70 = (Sequence *)local_16a;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_158,local_16a + 2,0x93,1,2,local_16a + 1,
               "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1102fc);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_178 = 1;
  Sequence::IncrementAndGet((Sequence *)(in_RDI + 0x78),&local_178);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_188,0x98,local_198);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc78,(char (*) [1])in_stack_fffffffffffffc70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1d2 + 2),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    Sequence::sequence((Sequence *)in_stack_fffffffffffffc78);
    local_1d2[1] = disruptor::MultiThreadedStrategy::HasAvailableCapacity
                             (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                              CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                              in_stack_fffffffffffffc84);
    local_1d2[0] = 1;
    in_stack_fffffffffffffc78 = "true";
    in_stack_fffffffffffffc70 = (Sequence *)local_1d2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1c0,local_1d2 + 2,0x98,1,2,local_1d2 + 1,
               "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1104a7);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x9c,local_1f8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc78,(char (*) [1])in_stack_fffffffffffffc70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_240 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    local_240._8_8_ =
         disruptor::MultiThreadedStrategy::IncrementAndGet
                   (in_stack_fffffffffffffca0,(Sequence *)in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffc90,
                    CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_240._0_8_ = local_b0[0] + 1;
    in_stack_fffffffffffffc78 = "return_value + 1L";
    in_stack_fffffffffffffc70 = (Sequence *)local_240;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_220,local_240 + 0x10,0x9c,1,2,local_240 + 8,
               "strategy.IncrementAndGet(cursor, one_dependents)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x11060b);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_248 = 8;
  Sequence::IncrementAndGet((Sequence *)(in_RDI + 0x78),&local_248);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0xa4,local_268);
    this_00 = (MultiThreadedStrategy *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc78,(char (*) [1])in_stack_fffffffffffffc70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2b0 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
               ,0x6c);
    in_stack_fffffffffffffc98 =
         (MultiThreadedStrategy *)
         disruptor::MultiThreadedStrategy::IncrementAndGet
                   (this_00,(Sequence *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                    CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_2b8 = 8;
    local_2b0._8_8_ = in_stack_fffffffffffffc98;
    in_stack_fffffffffffffc90 =
         (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
         Sequence::IncrementAndGet((Sequence *)(in_RDI + 0x78),&local_2b8);
    in_stack_fffffffffffffc78 = "sequence_1.IncrementAndGet(8)";
    in_stack_fffffffffffffc70 = (Sequence *)local_2b0;
    local_2b0._0_8_ = in_stack_fffffffffffffc90;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_290,local_2b0 + 0x10,0xa4,1,2,local_2b0 + 8,
               "strategy.IncrementAndGet(cursor, one_dependents, 8)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1107bc);
    in_stack_fffffffffffffc8f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc8f);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(HasAvailableCapacity) {
  auto one_dependents = oneDependents();
  Sequence cursor;

  int64_t return_value =
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(return_value, kInitialCursorValue + RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), false);

  // advance late consumers
  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), true);

  // only one slot free
  BOOST_CHECK_EQUAL(strategy.IncrementAndGet(cursor, one_dependents),
                    return_value + 1L);

  // dependent keeps up
  sequence_1.IncrementAndGet(RING_BUFFER_SIZE);

  // all equals
  BOOST_CHECK_EQUAL(
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE),
      sequence_1.IncrementAndGet(RING_BUFFER_SIZE));
}